

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmTim.c
# Opt level: O0

int Sfm_TimPriorityNodes(Sfm_Tim_t *p,Vec_Int_t *vCands,int Window)

{
  Abc_Ntk_t *pAVar1;
  int iVar2;
  uint uVar3;
  Abc_Obj_t *pAVar4;
  Vec_Int_t *p_00;
  int local_38;
  int local_34;
  int k;
  int i;
  Abc_Obj_t *pObj;
  Vec_Int_t *vLevel;
  int Window_local;
  Vec_Int_t *vCands_local;
  Sfm_Tim_t *p_local;
  
  if ((-1 < Window) && (Window < 0x65)) {
    Sfm_TimCriticalPath(p,Window);
    Sfm_TimUpdateClean(p);
    local_34 = 0;
    do {
      iVar2 = Vec_IntSize(&p->vPath);
      if (iVar2 <= local_34) {
        Vec_WecSort(&p->vLevels,0);
        Vec_IntClear(vCands);
        for (local_34 = 0; iVar2 = Vec_WecSize(&p->vLevels), local_34 < iVar2;
            local_34 = local_34 + 1) {
          p_00 = Vec_WecEntry(&p->vLevels,local_34);
          for (local_38 = 0; iVar2 = Vec_IntSize(p_00), local_38 < iVar2; local_38 = local_38 + 1) {
            pAVar1 = p->pNtk;
            iVar2 = Vec_IntEntry(p_00,local_38);
            pAVar4 = Abc_NtkObj(pAVar1,iVar2);
            if ((pAVar4 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar4->field_0x14 >> 4 & 1) == 0)) {
              uVar3 = Abc_ObjId(pAVar4);
              Vec_IntPush(vCands,uVar3);
            }
          }
        }
        iVar2 = Vec_IntSize(vCands);
        return (int)(0 < iVar2);
      }
      pAVar1 = p->pNtk;
      iVar2 = Vec_IntEntry(&p->vPath,local_34);
      pAVar4 = Abc_NtkObj(pAVar1,iVar2);
      if (pAVar4 != (Abc_Obj_t *)0x0) {
        if ((*(uint *)&pAVar4->field_0x14 >> 6 & 1) != 0) {
          __assert_fail("pObj->fMarkC == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sfm/sfmTim.c"
                        ,0x182,"int Sfm_TimPriorityNodes(Sfm_Tim_t *, Vec_Int_t *, int)");
        }
        *(uint *)&pAVar4->field_0x14 = *(uint *)&pAVar4->field_0x14 & 0xffffffbf | 0x40;
        iVar2 = Abc_ObjLevel(pAVar4);
        uVar3 = Abc_ObjId(pAVar4);
        Vec_WecPush(&p->vLevels,iVar2,uVar3);
      }
      local_34 = local_34 + 1;
    } while( true );
  }
  __assert_fail("Window >= 0 && Window <= 100",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sfm/sfmTim.c"
                ,0x17b,"int Sfm_TimPriorityNodes(Sfm_Tim_t *, Vec_Int_t *, int)");
}

Assistant:

int Sfm_TimPriorityNodes( Sfm_Tim_t * p, Vec_Int_t * vCands, int Window )
{
    Vec_Int_t * vLevel;
    Abc_Obj_t * pObj;
    int i, k;
    assert( Window >= 0 && Window <= 100 );
    // collect critical path
    Sfm_TimCriticalPath( p, Window );
    // add nodes to the levelized structure
    Sfm_TimUpdateClean( p );
    Abc_NtkForEachObjVec( &p->vPath, p->pNtk, pObj, i )
    {
        assert( pObj->fMarkC == 0 );
        pObj->fMarkC = 1;
        Vec_WecPush( &p->vLevels, Abc_ObjLevel(pObj), Abc_ObjId(pObj) );
    }
    // prioritize nodes by expected gain
    Vec_WecSort( &p->vLevels, 0 );
    Vec_IntClear( vCands );
    Vec_WecForEachLevel( &p->vLevels, vLevel, i )
        Abc_NtkForEachObjVec( vLevel, p->pNtk, pObj, k )
            if ( !pObj->fMarkA )
                Vec_IntPush( vCands, Abc_ObjId(pObj) );
//    printf( "Path = %5d   Cand = %5d\n", Vec_IntSize(&p->vPath) );
    return Vec_IntSize(vCands) > 0;
}